

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

optional<tinyusdz::Interpolation> *
tinyusdz::InterpolationFromString
          (optional<tinyusdz::Interpolation> *__return_storage_ptr__,string *v)

{
  bool bVar1;
  bool bVar2;
  storage_t<tinyusdz::Interpolation> sVar3;
  
  bVar1 = std::operator==("faceVarying",v);
  bVar2 = true;
  if (bVar1) {
    sVar3 = (storage_t<tinyusdz::Interpolation>)0x4;
  }
  else {
    bVar1 = std::operator==("constant",v);
    sVar3 = (storage_t<tinyusdz::Interpolation>)0x0;
    if (!bVar1) {
      bVar1 = std::operator==("uniform",v);
      if (bVar1) {
        sVar3 = (storage_t<tinyusdz::Interpolation>)0x1;
      }
      else {
        bVar1 = std::operator==("vertex",v);
        if (bVar1) {
          sVar3 = (storage_t<tinyusdz::Interpolation>)0x3;
        }
        else {
          bVar2 = std::operator==("varying",v);
          sVar3 = (storage_t<tinyusdz::Interpolation>)((uint)bVar2 * 2);
        }
      }
    }
  }
  __return_storage_ptr__->has_value_ = bVar2;
  __return_storage_ptr__->contained = sVar3;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Interpolation> InterpolationFromString(const std::string &v) {
  if ("faceVarying" == v) {
    return Interpolation::FaceVarying;
  } else if ("constant" == v) {
    return Interpolation::Constant;
  } else if ("uniform" == v) {
    return Interpolation::Uniform;
  } else if ("vertex" == v) {
    return Interpolation::Vertex;
  } else if ("varying" == v) {
    return Interpolation::Varying;
  }
  return nonstd::nullopt;
}